

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_led.c
# Opt level: O2

pal_result pal_led_set_color(pal_led_color color)

{
  pal_result pVar1;
  
  puts("This is the real pal_led_set_color\r");
  if (color - PAL_LED_RED < 3) {
    puts(&DAT_001020ec + *(int *)(&DAT_001020ec + (ulong)(color - PAL_LED_RED) * 4));
    pVar1 = PAL_OK;
  }
  else {
    pVar1 = PAL_ERROR_ARG;
  }
  return pVar1;
}

Assistant:

pal_result pal_led_set_color(pal_led_color color) {
    printf("This is the real pal_led_set_color\r\n");
    switch (color) {
    case PAL_LED_RED:    printf("LED: RED\r\n"); break;
    case PAL_LED_YELLOW: printf("LED: YELLOW\r\n"); break;
    case PAL_LED_GREEN:  printf("LED: GREEN\r\n"); break;
    default:             return PAL_ERROR_ARG;
    }
    return PAL_OK;
}